

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O1

Col_Word Col_Subrope(Col_Word rope,size_t first,size_t last)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong *puVar8;
  Col_Word CVar9;
  Cell *pacVar10;
  ulong uVar11;
  ulong first_00;
  byte bVar12;
  ulong uVar13;
  size_t byteLength;
  undefined8 local_b0;
  Col_StringFormat local_a8;
  undefined1 local_a4 [100];
  undefined8 local_40;
  size_t sStack_38;
  
  while( true ) {
    uVar3 = 0;
    if ((ulong *)rope != (ulong *)0x0) {
      if ((rope & 0xf) == 0) {
        uVar3 = -(uint)(((byte)*(ulong *)rope & 2) == 0) | (byte)*(ulong *)rope & 0xfffffffe;
      }
      else {
        uVar3 = immediateWordTypes[(uint)rope & 0x1f];
      }
    }
    local_b0 = (ulong *)rope;
    if ((uVar3 == 2) && ((*(ulong *)rope & 0xc0000) == 0)) {
      local_b0 = *(ulong **)(rope + 0x10);
    }
    if (last < first) {
      return 0xc;
    }
    sVar5 = Col_RopeLength((Col_Word)local_b0);
    puVar8 = local_b0;
    if (sVar5 <= first) {
      return 0xc;
    }
    uVar13 = sVar5 - 1;
    if (last < sVar5) {
      uVar13 = last;
    }
    byteLength = (uVar13 - first) + 1;
    if ((first == 0) && (byteLength == sVar5)) {
      return (Col_Word)local_b0;
    }
    if (local_b0 == (ulong *)0x0) {
      uVar3 = 0;
    }
    else if (((ulong)local_b0 & 0xf) == 0) {
      uVar3 = -(uint)(((byte)*local_b0 & 2) == 0) | (byte)*local_b0 & 0xfffffffe;
    }
    else {
      uVar3 = immediateWordTypes[(uint)local_b0 & 0x1f];
    }
    if (uVar3 != 0xe) break;
    rope = local_b0[1];
    first = first + local_b0[2];
    last = uVar13 + local_b0[2];
  }
  if ((int)uVar3 < -1) {
    if (uVar3 == 0xfffffffb) {
      CVar9 = Col_NewRope(COL_UCS1,(void *)((long)&local_b0 + first + 1),byteLength);
      return CVar9;
    }
    if (uVar3 == 0xfffffffc) {
      return (Col_Word)local_b0;
    }
LAB_00109ace:
    bVar12 = 0;
    goto LAB_00109b8e;
  }
  if (uVar3 == 0xffffffff) {
    pcVar1 = *(code **)((*local_b0 & 0xfffffffffffffffe) + 0x40);
    if ((pcVar1 == (code *)0x0) ||
       (puVar7 = (ulong *)(*pcVar1)(local_b0,first,uVar13), puVar7 == (ulong *)0x0)) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
      puVar8 = puVar7;
    }
    if (!bVar2) {
      return (Col_Word)puVar8;
    }
  }
  else {
    if (uVar3 != 6) {
      if (uVar3 != 0x12) goto LAB_00109ace;
      uVar6 = (ulong)*(ushort *)((long)local_b0 + 2);
      if (uVar6 == 0) {
        uVar6 = Col_RopeLength(local_b0[2]);
      }
      uVar11 = uVar13 - uVar6;
      if (uVar13 < uVar6) {
        uVar6 = local_b0[2];
        uVar11 = uVar13;
        first_00 = first;
LAB_00109b7d:
        puVar8 = (ulong *)Col_Subrope(uVar6,first_00,uVar11);
        bVar12 = 0;
        bVar2 = false;
      }
      else {
        first_00 = first - uVar6;
        if (uVar6 <= first) {
          uVar6 = local_b0[3];
          goto LAB_00109b7d;
        }
        bVar12 = *(byte *)((long)local_b0 + 1);
        bVar2 = true;
      }
      if (!bVar2) {
        return (Col_Word)puVar8;
      }
      goto LAB_00109b8e;
    }
    uVar6 = (ulong)((int)(char)*(byte *)((long)local_b0 + 1) & (COL_UCS4|COL_UCS2|COL_UCS1));
    uVar11 = byteLength * uVar6;
    if (uVar11 < 0x5d) {
      CVar9 = Col_NewRope((int)(char)*(byte *)((long)local_b0 + 1),
                          (byte *)((long)local_b0 + uVar6 * first + 4),uVar11);
      return CVar9;
    }
  }
  bVar12 = 0;
LAB_00109b8e:
  if (byteLength < 0x61) {
    local_40 = 0;
    sStack_38 = 0;
    iVar4 = Col_TraverseRopeChunks
                      ((Col_Word)local_b0,first,byteLength,0,MergeRopeChunksProc,&local_a8,
                       (size_t *)0x0);
    if (iVar4 == 0) {
      CVar9 = Col_NewRope(local_a8,local_a4,sStack_38);
      return CVar9;
    }
  }
  pacVar10 = AllocCells(1);
  (*pacVar10)[0] = '\x0e';
  (*pacVar10)[1] = bVar12;
  *(ulong **)(*pacVar10 + 8) = local_b0;
  *(size_t *)(*pacVar10 + 0x10) = first;
  *(ulong *)(*pacVar10 + 0x18) = uVar13;
  return (Col_Word)pacVar10;
}

Assistant:

Col_Word
Col_Subrope(
    Col_Word rope,              /*!< The rope to extract the subrope from. */
    size_t first,               /*!< Index of first character in subrope. */
    size_t last)                /*!< Index of last character in subrope. */
{
    Col_Word subrope;           /* Resulting rope in the general case. */
    size_t ropeLength;          /* Length of source rope. */
    unsigned char depth=0;      /* Depth of source rope. */
    size_t length;              /* Length of resulting subrope. */

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) return WORD_NIL;

    WORD_UNWRAP(rope);

    /*
     * Quick cases.
     */

    if (last < first) {
        /*
         * Invalid range.
         */

        return WORD_SMALLSTR_EMPTY;
    }

    ropeLength = Col_RopeLength(rope);
    if (first >= ropeLength) {
        /*
         * Beginning is past the end of the string.
         */

        return WORD_SMALLSTR_EMPTY;
    }

    if (last >= ropeLength) {
        /*
         * Truncate overlong subropes. (Note: at this point ropeLength > 1)
         */

        last = ropeLength-1;
    }

    length = last-first+1;

    if (first == 0 && length == ropeLength) {
        /*
         * Identity.
         */

        return rope;
    }

    /*
     * Type-specific quick cases.
     */

    switch (WORD_TYPE(rope)) {
    /*
     * Immediate types.
     */

    case WORD_TYPE_CHARBOOL:
        /*
         * Identity, already done.
         */

        ASSERT(WORD_CHAR_WIDTH(rope));
        ASSERT(0);
        return rope;

    case WORD_TYPE_SMALLSTR:
        return Col_NewRope(COL_UCS1, WORD_SMALLSTR_DATA(rope)+first, length);

    /*
     * Handle fixed width leaf ropes directly; this will be faster than the
     * generic case below.
     */

    case WORD_TYPE_UCSSTR: {
        Col_StringFormat format = (Col_StringFormat) WORD_UCSSTR_FORMAT(rope);
        if (length * CHAR_WIDTH(format) <= MAX_SHORT_LEAF_SIZE
                - UCSSTR_HEADER_SIZE) {
            return Col_NewRope(format, WORD_UCSSTR_DATA(rope)
                    + first * CHAR_WIDTH(format),
                    length * CHAR_WIDTH(format));
        }
        break;
        }

    case WORD_TYPE_SUBROPE:
        /*
         * Point to original source.
         */

        return Col_Subrope(WORD_SUBROPE_SOURCE(rope),
                WORD_SUBROPE_FIRST(rope)+first,
                WORD_SUBROPE_FIRST(rope)+last);

    case WORD_TYPE_CONCATROPE: {
        /*
         * Try to find the deepest superset of the subrope.
         */

        size_t leftLength = WORD_CONCATROPE_LEFT_LENGTH(rope);
        if (leftLength == 0) {
            leftLength = Col_RopeLength(WORD_CONCATROPE_LEFT(rope));
        }
        if (last < leftLength) {
            /*
             * Left arm is a superset of subrope.
             */

            return Col_Subrope(WORD_CONCATROPE_LEFT(rope), first, last);
        } else if (first >= leftLength) {
            /*
             * Right arm is a superset of subrope.
             */

            return Col_Subrope(WORD_CONCATROPE_RIGHT(rope), first-leftLength,
                    last-leftLength);
        }
        depth = WORD_CONCATROPE_DEPTH(rope);
        break;
        }

    case WORD_TYPE_CUSTOM: {
        Col_CustomRopeType *typeInfo
                = (Col_CustomRopeType *) WORD_TYPEINFO(rope);
        ASSERT(typeInfo->type.type == COL_ROPE);
        if (typeInfo->subropeProc) {
            if ((subrope = typeInfo->subropeProc(rope, first, last))
                    != WORD_NIL) {
                return subrope;
            }
        }
        break;
        }

        /* WORD_TYPE_UNKNOWN */
    }

    /*
     * Try to build a short subrope if possible.
     *
     * Make the test on char length, the traversal will check for byte length.
     */

    if (length <= MAX_SHORT_LEAF_SIZE) {
        MergeRopeChunksInfo info;
        info.length = 0;
        info.byteLength = 0;

        if (Col_TraverseRopeChunks(rope, first, length, 0, MergeRopeChunksProc,
                &info, NULL) == 0) {
            /*
             * Zero result means data fits into one short leaf.
             */

            return Col_NewRope(info.format, info.data, info.byteLength);
        }
    }

    /*
     * General case: build a subrope node.
     */

    subrope = (Col_Word) AllocCells(1);
    WORD_SUBROPE_INIT(subrope, depth, rope, first, last);

    return subrope;
}